

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fftnd.c
# Opt level: O3

void kiss_fftnd(kiss_fftnd_cfg st,kiss_fft_cpx *fin,kiss_fft_cpx *fout)

{
  int iVar1;
  int in_stride;
  kiss_fft_cpx *pkVar2;
  uint uVar3;
  long lVar4;
  kiss_fft_cpx *pkVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar3 = st->ndims;
  pkVar2 = fout;
  if ((uVar3 & 1) == 0) {
    pkVar2 = st->tmpbuf;
  }
  else if (fin == fout) {
    memcpy(st->tmpbuf,fin,(long)st->dimprod << 3);
    fin = st->tmpbuf;
    uVar3 = st->ndims;
  }
  if (0 < (int)uVar3) {
    lVar4 = 0;
    do {
      iVar1 = st->dims[lVar4];
      uVar6 = (long)st->dimprod / (long)iVar1;
      in_stride = (int)uVar6;
      if (0 < in_stride) {
        uVar6 = uVar6 & 0xffffffff;
        pkVar5 = pkVar2;
        do {
          kiss_fft_stride(st->states[lVar4],fin,pkVar5,in_stride);
          pkVar5 = pkVar5 + iVar1;
          fin = fin + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
        uVar3 = st->ndims;
      }
      pkVar5 = st->tmpbuf;
      bVar7 = pkVar2 == pkVar5;
      pkVar2 = pkVar5;
      fin = fout;
      if (bVar7) {
        pkVar2 = fout;
        fin = pkVar5;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (int)uVar3);
  }
  return;
}

Assistant:

void kiss_fftnd(kiss_fftnd_cfg st,const kiss_fft_cpx *fin,kiss_fft_cpx *fout)
{
    int i,k;
    const kiss_fft_cpx * bufin=fin;
    kiss_fft_cpx * bufout;

    /*arrange it so the last bufout == fout*/
    if ( st->ndims & 1 ) {
        bufout = fout;
        if (fin==fout) {
            memcpy( st->tmpbuf, fin, sizeof(kiss_fft_cpx) * st->dimprod );
            bufin = st->tmpbuf;
        }
    }else
        bufout = st->tmpbuf;

    for ( k=0; k < st->ndims; ++k) {
        int curdim = st->dims[k];
        int stride = st->dimprod / curdim;

        for ( i=0 ; i<stride ; ++i ) 
            kiss_fft_stride( st->states[k], bufin+i , bufout+i*curdim, stride );

        /*toggle back and forth between the two buffers*/
        if (bufout == st->tmpbuf){
            bufout = fout;
            bufin = st->tmpbuf;
        }else{
            bufout = st->tmpbuf;
            bufin = fout;
        }
    }
}